

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Mat *pMVar2;
  size_t sVar3;
  int iVar4;
  int *_coffset_00;
  Option *pOVar5;
  int iVar6;
  int _woffset;
  int local_128;
  int _hoffset;
  Mat *local_120;
  int local_118;
  int _outw;
  Option *local_110;
  int _outh;
  size_t local_100;
  int _outc;
  int _coffset;
  Mat m;
  Mat bottom_blob_sliced;
  Mat borderm;
  
  iVar6 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  local_128 = bottom_blob->c;
  iVar4 = bottom_blob->dims;
  local_100 = bottom_blob->elemsize;
  local_120 = top_blob;
  local_110 = opt;
  Mat::shape(&bottom_blob_sliced,bottom_blob);
  _coffset_00 = &_coffset;
  resolve_crop_roi(this,&bottom_blob_sliced,&_woffset,&_hoffset,_coffset_00,&_outw,&_outh,&_outc);
  Mat::~Mat(&bottom_blob_sliced);
  sVar3 = local_100;
  pMVar2 = local_120;
  if (iVar4 == 3) {
    if ((iVar1 != _outh || iVar6 != _outw) || (_outc != local_128)) {
      iVar4 = _outc;
      Mat::channel_range(&bottom_blob_sliced,bottom_blob,_coffset,_outc);
      sVar3 = local_100;
      pMVar2 = local_120;
      if (iVar1 != _outh || iVar6 != _outw) {
        Mat::create(local_120,_outw,_outh,_outc,local_100,local_110->blob_allocator);
        iVar6 = -100;
        if ((pMVar2->data != (void *)0x0) && ((long)pMVar2->c * pMVar2->cstep != 0)) {
          local_128 = _hoffset;
          iVar6 = 0;
          local_110 = (Option *)(ulong)(uint)_outc;
          if (_outc < 1) {
            local_110 = (Option *)0x0;
          }
          local_118 = _woffset;
          for (pOVar5 = (Option *)0x0; local_110 != pOVar5; pOVar5 = (Option *)&pOVar5->field_0x1) {
            m.data = (void *)(bottom_blob_sliced.cstep * (long)pOVar5 * bottom_blob_sliced.elemsize
                             + (long)bottom_blob_sliced.data);
            m.refcount = (int *)0x0;
            m.elemsize = bottom_blob_sliced.elemsize;
            m.elempack = bottom_blob_sliced.elempack;
            m.allocator = bottom_blob_sliced.allocator;
            m.dims = 2;
            m.w = bottom_blob_sliced.w;
            m.h = bottom_blob_sliced.h;
            m.c = 1;
            m.cstep = (size_t)(bottom_blob_sliced.h * bottom_blob_sliced.w);
            Mat::channel(&borderm,pMVar2,(int)pOVar5);
            if (sVar3 == 4) {
              copy_cut_border_image<float>(&m,&borderm,local_128,local_118);
            }
            else if (sVar3 == 2) {
              copy_cut_border_image<unsigned_short>(&m,&borderm,local_128,local_118);
            }
            else if (sVar3 == 1) {
              copy_cut_border_image<signed_char>(&m,&borderm,local_128,local_118);
            }
            Mat::~Mat(&borderm);
            Mat::~Mat(&m);
          }
        }
      }
      else {
        Mat::clone(&m,(__fn *)&bottom_blob_sliced,(void *)0x0,iVar4,_coffset_00);
        pMVar2 = local_120;
        Mat::operator=(local_120,&m);
        Mat::~Mat(&m);
        if ((pMVar2->data == (void *)0x0) || (iVar6 = 0, (long)pMVar2->c * pMVar2->cstep == 0)) {
          iVar6 = -100;
        }
      }
      Mat::~Mat(&bottom_blob_sliced);
      return iVar6;
    }
  }
  else if (iVar4 == 2) {
    if (iVar1 != _outh || iVar6 != _outw) {
      Mat::create(local_120,_outw,_outh,local_100,local_110->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (sVar3 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar2,_hoffset,_woffset);
        return 0;
      }
      if (sVar3 != 2) {
        if (sVar3 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar2,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar2,_hoffset,_woffset);
      return 0;
    }
  }
  else {
    if (iVar4 != 1) {
      return 0;
    }
    if (_outw != iVar6) {
      Mat::create(local_120,_outw,local_100,local_110->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (sVar3 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar2,0,_woffset);
        return 0;
      }
      if (sVar3 == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar2,0,_woffset);
        return 0;
      }
      if (sVar3 == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar2,0,_woffset);
        return 0;
      }
      return 0;
    }
  }
  Mat::operator=(local_120,bottom_blob);
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}